

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O3

Vec_Int_t * Nm_ManReturnNameIds(Nm_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *__ptr;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = p->nEntries;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar4 = iVar5;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar4;
  if (iVar4 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)iVar4 << 2);
  }
  pVVar3->pArray = __ptr;
  iVar5 = p->nBins;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      if (p->pBinsI2N[lVar6] != (Nm_Entry_t *)0x0) {
        uVar1 = p->pBinsI2N[lVar6]->ObjId;
        uVar2 = pVVar3->nSize;
        if (uVar2 == pVVar3->nCap) {
          if ((int)uVar2 < 0x10) {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc(0x40);
            }
            else {
              __ptr = (int *)realloc(__ptr,0x40);
            }
            pVVar3->pArray = __ptr;
            iVar5 = 0x10;
            if (__ptr == (int *)0x0) {
LAB_0049da94:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
          else {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc((ulong)uVar2 * 8);
            }
            else {
              __ptr = (int *)realloc(__ptr,(ulong)uVar2 * 8);
            }
            pVVar3->pArray = __ptr;
            if (__ptr == (int *)0x0) goto LAB_0049da94;
            iVar5 = uVar2 * 2;
          }
          pVVar3->nCap = iVar5;
        }
        pVVar3->nSize = uVar2 + 1;
        __ptr[(int)uVar2] = uVar1;
        iVar5 = p->nBins;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Nm_ManReturnNameIds( Nm_Man_t * p )
{
    Vec_Int_t * vNameIds;
    int i;
    vNameIds = Vec_IntAlloc( p->nEntries );
    for ( i = 0; i < p->nBins; i++ )
        if ( p->pBinsI2N[i] )
            Vec_IntPush( vNameIds, p->pBinsI2N[i]->ObjId );
    return vNameIds;
}